

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O2

int Dsd_TreeCollectDecomposableVars_rec(DdManager *dd,Dsd_Node_t *pNode,int *pVars,int *nVars)

{
  ushort uVar1;
  Dsd_Type_t DVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  
  if (dd == (DdManager *)0x0) {
    __assert_fail("pNode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/dsd/dsdTree.c"
                  ,500,
                  "int Dsd_TreeCollectDecomposableVars_rec(DdManager *, Dsd_Node_t *, int *, int *)"
                 );
  }
  if (((ulong)dd & 1) == 0) {
    uVar1 = *(ushort *)((long)&(dd->sentinel).Id + 4);
    iVar8 = 0;
    if (1 < (short)uVar1) {
      iVar8 = 1;
      bVar3 = false;
      for (lVar9 = 0; lVar9 < (short)uVar1; lVar9 = lVar9 + 1) {
        iVar4 = Dsd_TreeCollectDecomposableVars_rec
                          ((DdManager *)
                           (*(ulong *)(&((dd->sentinel).type.kids.E)->index + lVar9 * 2) &
                           0xfffffffffffffffe),pNode,pVars,(int *)(long)(short)uVar1);
        if (iVar4 != 0) {
          bVar3 = true;
        }
        uVar1 = *(ushort *)((long)&(dd->sentinel).Id + 4);
      }
      if ((!bVar3) && (((short)uVar1 < 5 || ((dd->sentinel).index - 3 < 2)))) {
        iVar8 = 0;
        uVar5 = 0;
        if (0 < (short)uVar1) {
          uVar5 = (ulong)uVar1;
        }
        for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          piVar7 = (int *)(*(ulong *)(&((dd->sentinel).type.kids.E)->index + uVar6 * 2) &
                          0xfffffffffffffffe);
          if (*piVar7 == 2) {
            if (pNode == (Dsd_Node_t *)0x0) {
              *pVars = *pVars + 1;
            }
            else {
              DVar2 = **(Dsd_Type_t **)(piVar7 + 4);
              iVar4 = *pVars;
              *pVars = iVar4 + 1;
              (&pNode->Type)[iVar4] = DVar2;
            }
          }
        }
      }
    }
    return iVar8;
  }
  __assert_fail("!Dsd_IsComplement( pNode )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/dsd/dsdTree.c"
                ,0x1f5,
                "int Dsd_TreeCollectDecomposableVars_rec(DdManager *, Dsd_Node_t *, int *, int *)");
}

Assistant:

int Dsd_TreeCollectDecomposableVars_rec( DdManager * dd, Dsd_Node_t * pNode, int * pVars, int * nVars )
{
    int fSkipThisNode, i;
    Dsd_Node_t * pTemp;
    int fVerbose = 0;

    assert( pNode );
    assert( !Dsd_IsComplement( pNode ) );

    if ( pNode->nDecs <= 1 )
        return 0;

    // go through the list of successors and call recursively 
    fSkipThisNode = 0;
    for ( i = 0; i < pNode->nDecs; i++ )
        if ( Dsd_TreeCollectDecomposableVars_rec(dd, Dsd_Regular(pNode->pDecs[i]), pVars, nVars) )
            fSkipThisNode = 1;

    if ( !fSkipThisNode && (pNode->Type == DSD_NODE_OR || pNode->Type == DSD_NODE_EXOR || pNode->nDecs <= 4) )
    {
if ( fVerbose )
printf( "Node of type <%d> (OR=6,EXOR=8,RAND=1): ", pNode->Type );

        for ( i = 0; i < pNode->nDecs; i++ )
        {
            pTemp = Dsd_Regular(pNode->pDecs[i]);
            if ( pTemp->Type == DSD_NODE_BUF )
            {
                if ( pVars )
                    pVars[ (*nVars)++ ] = pTemp->S->index;
                else
                    (*nVars)++;
                    
if ( fVerbose )
printf( "%d ", pTemp->S->index );
            }
        }
if ( fVerbose )
printf( "\n" );
    }
    else
        fSkipThisNode = 1;


    return fSkipThisNode;
}